

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Theory.cpp
# Opt level: O0

RationalConstantType * __thiscall
Kernel::RationalConstantType::operator/(RationalConstantType *this,RationalConstantType *o)

{
  RationalConstantType *in_RDI;
  RationalConstantType rhs;
  RationalConstantType lhs;
  RationalConstantType *in_stack_ffffffffffffff78;
  RationalConstantType *in_stack_ffffffffffffff80;
  InnerType *in_stack_ffffffffffffff90;
  InnerType *in_stack_ffffffffffffff98;
  RationalConstantType *in_stack_ffffffffffffffa0;
  
  RationalConstantType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  RationalConstantType(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  IntegerConstantType::operator*(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  IntegerConstantType::operator*(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  RationalConstantType
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x9b134c);
  IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x9b1356);
  ~RationalConstantType(in_RDI);
  ~RationalConstantType(in_RDI);
  return in_RDI;
}

Assistant:

RationalConstantType RationalConstantType::operator/(const RationalConstantType& o) const
{
  auto lhs = *this;
  auto rhs = o;
  return RationalConstantType(
      lhs._num * rhs._den, 
      lhs._den * rhs._num);
}